

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

VertexBufferObject<float> * __thiscall
gl3cts::ClipDistance::FunctionalTest::prepareGeometry
          (FunctionalTest *this,Functions *gl,GLenum primitive_type)

{
  VertexBufferObject<float> *this_00;
  float local_4c;
  vector<float,_std::allocator<float>_> data;
  _Vector_base<float,_std::allocator<float>_> local_28;
  
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (primitive_type == 4) {
    local_4c = -1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = -1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 0.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 0.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 0.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = -1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 0.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
  }
  else if (primitive_type == 1) {
    local_4c = 1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 0.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = -1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = -1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 0.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
  }
  else {
    if (primitive_type != 0) {
      this_00 = (VertexBufferObject<float> *)0x0;
      goto LAB_00ae9ff1;
    }
    local_4c = 0.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 0.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 0.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
    local_4c = 1.0;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(&data,&local_4c);
  }
  this_00 = (VertexBufferObject<float> *)operator_new(0x30);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_28,&data);
  Utility::VertexBufferObject<float>::VertexBufferObject
            (this_00,gl,0x8892,(vector<float,_std::allocator<float>_> *)&local_28);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_28);
LAB_00ae9ff1:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&data.super__Vector_base<float,_std::allocator<float>_>);
  return this_00;
}

Assistant:

gl3cts::ClipDistance::Utility::VertexBufferObject<glw::GLfloat>* gl3cts::ClipDistance::FunctionalTest::prepareGeometry(
	const glw::Functions& gl, const glw::GLenum primitive_type)
{
	std::vector<glw::GLfloat> data;

	switch (primitive_type)
	{
	case GL_POINTS:
		data.push_back(0.0);
		data.push_back(0.0);
		data.push_back(0.0);
		data.push_back(1.0);
		break;
	case GL_LINES:
		data.push_back(1.0);
		data.push_back(1.0);
		data.push_back(0.0);
		data.push_back(1.0);
		data.push_back(-1.0);
		data.push_back(-1.0);
		data.push_back(0.0);
		data.push_back(1.0);
		break;
	case GL_TRIANGLES:
		data.push_back(-1.0);
		data.push_back(-1.0);
		data.push_back(0.0);
		data.push_back(1.0);
		data.push_back(0.0);
		data.push_back(1.0);
		data.push_back(0.0);
		data.push_back(1.0);
		data.push_back(1.0);
		data.push_back(-1.0);
		data.push_back(0.0);
		data.push_back(1.0);
		break;
	default:
		return NULL;
	}

	return new gl3cts::ClipDistance::Utility::VertexBufferObject<glw::GLfloat>(gl, GL_ARRAY_BUFFER, data);
}